

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O0

int helix_session_process_packet(helix_session_t session,char *buf,size_t len)

{
  int iVar1;
  session *psVar2;
  size_t in_RDX;
  char *in_RSI;
  helix_session_t in_RDI;
  unknown_message_type *e;
  truncated_packet_error *e_1;
  packet_view local_40 [2];
  size_t local_20;
  char *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  psVar2 = unwrap(in_RDI);
  helix::net::packet_view::packet_view(local_40,local_18,local_20);
  iVar1 = (*psVar2->_vptr_session[6])(psVar2,local_40);
  return iVar1;
}

Assistant:

int helix_session_process_packet(helix_session_t session, const char* buf, size_t len)
{
    try {
        return unwrap(session)->process_packet(helix::net::packet_view{buf, len});
    } catch (const helix::unknown_message_type& e) {
        return HELIX_ERROR_UNKNOWN_MESSAGE_TYPE;
    } catch (const helix::truncated_packet_error& e) {
        return HELIX_ERROR_TRUNCATED_PACKET;
    } catch (...) {
       return HELIX_ERROR_UNKNOWN;
    }
}